

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O2

void Assimp::IFC::ExtractVerticesFromClipper
               (Polygon *poly,
               vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *temp_contour,
               bool filter_duplicates)

{
  pointer paVar1;
  pointer pIVar2;
  bool bVar3;
  IntPoint *point;
  pointer pIVar4;
  undefined1 auVar5 [16];
  IfcVector2 local_38;
  
  paVar1 = (temp_contour->
           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((temp_contour->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish != paVar1) {
    (temp_contour->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = paVar1;
  }
  pIVar4 = (poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pIVar4 == pIVar2) {
      return;
    }
    auVar5._0_8_ = (double)pIVar4->X;
    auVar5._8_8_ = (double)pIVar4->Y;
    auVar5 = divpd(auVar5,_DAT_005ff660);
    auVar5 = maxpd(ZEXT816(0),auVar5);
    local_38 = (IfcVector2)minpd(_DAT_005ca340,auVar5);
    if (filter_duplicates) {
      bVar3 = IsDuplicateVertex(&local_38,temp_contour);
      if (!bVar3) goto LAB_00504a1a;
    }
    else {
LAB_00504a1a:
      std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::push_back
                (temp_contour,&local_38);
    }
    pIVar4 = pIVar4 + 1;
  } while( true );
}

Assistant:

void ExtractVerticesFromClipper(const ClipperLib::Polygon& poly, std::vector<IfcVector2>& temp_contour,
    bool filter_duplicates = false)
{
    temp_contour.clear();
    for(const ClipperLib::IntPoint& point : poly) {
        IfcVector2 vv = IfcVector2( from_int64(point.X), from_int64(point.Y));
        vv = std::max(vv,IfcVector2());
        vv = std::min(vv,one_vec);

        if (!filter_duplicates || !IsDuplicateVertex(vv, temp_contour)) {
            temp_contour.push_back(vv);
        }
    }
}